

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int * Extra_SupportArray(DdManager *dd,DdNode *f,int *support)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = dd->sizeZ;
  if (dd->sizeZ < dd->size) {
    uVar1 = dd->size;
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    support[uVar3] = 0;
  }
  ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
  ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  return support;
}

Assistant:

int * 
Extra_SupportArray(
  DdManager * dd, /* manager */
  DdNode * f,     /* DD whose support is sought */
  int * support ) /* array allocated by the user */
{
    int i, size;

    /* Initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    for (i = 0; i < size; i++) 
        support[i] = 0;
    
    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}